

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O3

bool __thiscall
ON_NurbsCurve::InsertKnot(ON_NurbsCurve *this,double knot_value,int knot_multiplicity)

{
  int iVar1;
  double dVar2;
  double dVar3;
  int i;
  int iVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  int iVar9;
  double *pdVar10;
  char *sFormat;
  int iVar11;
  undefined4 extraout_XMM0_Db;
  int span_hint;
  undefined4 uStack_3c;
  int iVar8;
  
  iVar7 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x2c])();
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(this);
  uStack_3c = extraout_XMM0_Db;
  bVar5 = ON_Interval::IsIncreasing((ON_Interval *)&span_hint);
  if (!bVar5) {
    return false;
  }
  pdVar10 = ON_Interval::operator[]((ON_Interval *)&span_hint,0);
  dVar2 = *pdVar10;
  pdVar10 = ON_Interval::operator[]((ON_Interval *)&span_hint,1);
  if (knot_multiplicity < 1 || iVar7 < knot_multiplicity) {
    sFormat = "ON_NurbsCurve::ON_InsertKnot(): knot_multiplicity < 1 or knot_multiplicity > degree."
    ;
    iVar7 = 0x9d3;
  }
  else if ((knot_value < dVar2) || (dVar3 = *pdVar10, dVar3 < knot_value)) {
    sFormat = "ON_InsertKnot(): knot_value not in NURBS curve domain.";
    iVar7 = 0x9d9;
  }
  else if ((dVar2 != knot_value) || (NAN(dVar2) || NAN(knot_value))) {
    if ((dVar3 != knot_value) || (NAN(dVar3) || NAN(knot_value))) {
      ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
      if (iVar7 < 2) {
        cVar6 = '\0';
      }
      else {
        iVar8 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x35])
                          (this);
        cVar6 = (char)iVar8;
      }
      iVar8 = ON_NurbsSpanIndex(this->m_order,this->m_cv_count,this->m_knot,knot_value,0,0);
      bVar5 = ReserveCVCapacity(this,(this->m_cv_count + knot_multiplicity) * this->m_cv_stride);
      if (!bVar5) {
        return false;
      }
      iVar9 = ON_KnotCount(this->m_order,this->m_cv_count);
      bVar5 = ReserveKnotCapacity(this,iVar9 + knot_multiplicity);
      if (!bVar5) {
        return false;
      }
      _span_hint = (double)CONCAT44(uStack_3c,iVar8);
      iVar9 = 0;
      if (0 < this->m_dim) {
        iVar9 = (this->m_dim + 1) - (uint)(this->m_is_rat == 0);
      }
      iVar9 = ON_InsertKnot(knot_value,knot_multiplicity,iVar9,this->m_order,this->m_cv_count,
                            this->m_cv_stride,this->m_cv,this->m_knot,&span_hint);
      if (0 < iVar9) {
        this->m_cv_count = this->m_cv_count + iVar9;
      }
      if ((cVar6 != '\0') &&
         (iVar9 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x35])
                            (this), (char)iVar9 == '\0')) {
        bVar5 = ON_MakeKnotVectorPeriodic(this->m_order,this->m_cv_count,this->m_knot);
        if (bVar5) {
          iVar9 = this->m_cv_count;
          iVar11 = 0;
          do {
            iVar1 = (iVar9 - iVar7) + iVar11;
            i = iVar1;
            iVar4 = iVar11;
            if (iVar11 <= iVar8) {
              i = iVar11;
              iVar4 = iVar1;
            }
            pdVar10 = this->m_cv + (long)iVar4 * (long)this->m_cv_stride;
            if (this->m_cv == (double *)0x0) {
              pdVar10 = (double *)0x0;
            }
            SetCV(this,i,intrinsic_point_style,pdVar10);
            iVar11 = iVar11 + 1;
          } while (iVar7 != iVar11);
        }
        else {
          ClampEnd(this,2);
        }
      }
      return true;
    }
    if (iVar7 == knot_multiplicity) {
      iVar7 = 1;
      goto LAB_0053d9db;
    }
    if (knot_multiplicity == 1) {
      return true;
    }
    sFormat = "ON_InsertKnot(): knot_value = t1 and 1 < knot_multiplicity < degree.";
    iVar7 = 0x9fb;
  }
  else {
    if (iVar7 == knot_multiplicity) {
      iVar7 = 0;
LAB_0053d9db:
      bVar5 = ClampEnd(this,iVar7);
      return bVar5;
    }
    if (knot_multiplicity == 1) {
      return true;
    }
    sFormat = "ON_InsertKnot(): knot_value = t0 and 1 < knot_multiplicity < degree.";
    iVar7 = 0x9e9;
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_nurbscurve.cpp"
             ,iVar7,"",sFormat);
  return false;
}

Assistant:

bool ON_NurbsCurve::InsertKnot( double knot_value, int knot_multiplicity )
{
  bool rc = false;

  const int degree = Degree();

  double t0, t1;
  {
    ON_Interval d = Domain();
    if ( !d.IsIncreasing() )
      return false;
    t0 = d[0];
    t1 = d[1];
  }
  
  if ( knot_multiplicity < 1 || knot_multiplicity > degree ) 
  {
    ON_ERROR("ON_NurbsCurve::ON_InsertKnot(): knot_multiplicity < 1 or knot_multiplicity > degree.");
    return false;
  }

  if( knot_value < t0 || knot_value > t1 )
  {
    ON_ERROR("ON_InsertKnot(): knot_value not in NURBS curve domain.");
    return false;
  }

  if ( knot_value == t0 ) 
  {
    if ( knot_multiplicity == degree ) 
    {
      rc = ClampEnd(0);
    }
    else if ( knot_multiplicity == 1 ) 
    {
      rc = true;
    }
    else 
    {
      ON_ERROR("ON_InsertKnot(): knot_value = t0 and 1 < knot_multiplicity < degree.");
      rc = false;
    }
    return rc;
  }

  if ( knot_value == t1 ) 
  {
    if ( knot_multiplicity == degree ) 
    {
      rc = ClampEnd(1);
    }
    else if ( knot_multiplicity == 1 ) 
    {
      rc = true;
    }
    else 
    {
      ON_ERROR("ON_InsertKnot(): knot_value = t1 and 1 < knot_multiplicity < degree.");
      rc = false;
    }
    return rc;
  }

  DestroyCurveTree();

  bool bIsPeriodic = (degree>1) ? IsPeriodic() : false;
  int span_index = ON_NurbsSpanIndex( m_order, m_cv_count, m_knot, knot_value, 0, 0 );

  // reserve room for new knots and cvs
  if ( !ReserveCVCapacity( m_cv_stride*(m_cv_count+knot_multiplicity) ) )
    return false;
  if ( !ReserveKnotCapacity( KnotCount()+knot_multiplicity ) )
    return false;
  if ( bIsPeriodic ) {
  }

  rc = true;
  int span_hint = span_index;
  int new_knot_count = ON_InsertKnot( knot_value, knot_multiplicity, 
                                      CVSize(), m_order, m_cv_count, 
                                      m_cv_stride, m_cv, m_knot, &span_hint );
  if ( new_knot_count > 0 ) 
  {
    m_cv_count += new_knot_count;
  }

  if ( bIsPeriodic && rc && !IsPeriodic() ) {
    // restore periodic form
    if ( ON_MakeKnotVectorPeriodic( m_order, m_cv_count, m_knot ) ) {
      int i0, i1;
      for ( i0 = 0, i1 = m_cv_count-degree; i0 < degree; i0++, i1++ ) {
        //14 May 2015 - Chuck - Fix for curves with low span count.  See RH-30358
        //if ( span_index < degree-1)
        if (i0 > span_index)
          SetCV( i1, ON::intrinsic_point_style, CV(i0) ); // cv[i1] = cv[i0]
        else
          SetCV( i0, ON::intrinsic_point_style, CV(i1) ); // cv[i0] = cv[i1]
      }
    }
    else {
      ClampEnd(2);
    }
  }

  return rc;
}